

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ToStringInternal(JSContext *ctx,JSValue val,BOOL is_ToPropertyKey)

{
  JSValue val_00;
  JSValue v;
  JSValue v_00;
  int iVar1;
  int in_ECX;
  JSContext *ctx_00;
  undefined8 in_RDX;
  ulong in_RSI;
  JSContext *in_RDI;
  JSValue v_01;
  JSContext *unaff_retaddr;
  JSValue ret;
  JSValue val1;
  char buf [32];
  char *str;
  uint32_t tag;
  JSAtom in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff68 [16];
  JSValue in_stack_ffffffffffffff78;
  char local_58 [36];
  BOOL is_ToPropertyKey_00;
  undefined4 uVar2;
  undefined4 uVar3;
  int local_18;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  is_ToPropertyKey_00 = (BOOL)((ulong)stack0xffffffffffffffc8 >> 0x20);
  uVar2 = (undefined4)in_RSI;
  uVar3 = (undefined4)(in_RSI >> 0x20);
  local_18 = (int)in_RDX;
  iVar1 = (int)((ulong)in_RDX >> 0x20);
  ctx_00 = (JSContext *)(ulong)(local_18 + 8);
  switch(ctx_00) {
  case (JSContext *)0x0:
    if (in_ECX == 0) {
      v_01 = JS_ThrowTypeError(in_RDI,"cannot convert symbol to string");
    }
    else {
      v_00.tag._0_4_ = local_18;
      v_00.u = (JSValueUnion)in_RSI;
      v_00.tag._4_4_ = iVar1;
      v_01 = JS_DupValue(in_RDI,v_00);
    }
    break;
  case (JSContext *)0x1:
    v.tag._0_4_ = local_18;
    v.u = (JSValueUnion)in_RSI;
    v.tag._4_4_ = iVar1;
    v_01 = JS_DupValue(in_RDI,v);
    break;
  default:
    stack0xffffffffffffffc8 = "[unsupported type]";
    goto LAB_00132bcb;
  case (JSContext *)0x6:
    stack0xffffffffffffffc8 = "[function bytecode]";
    goto LAB_00132bcb;
  case (JSContext *)0x7:
    v_01 = JS_ToPrimitive(in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff68._4_4_);
    iVar1 = JS_IsException(v_01);
    if (iVar1 == 0) {
      val_00.tag._0_4_ = uVar2;
      val_00.u.ptr = in_RDI;
      val_00.tag._4_4_ = uVar3;
      v_01 = JS_ToStringInternal((JSContext *)CONCAT44(in_ECX,local_18),val_00,is_ToPropertyKey_00);
      JS_FreeValue(ctx_00,v_01);
    }
    break;
  case (JSContext *)0x8:
    snprintf(local_58,0x20,"%d",in_RSI & 0xffffffff);
    unique0x00004e80 = local_58;
LAB_00132bcb:
    v_01 = JS_NewString(in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_);
    break;
  case (JSContext *)0x9:
    v_01 = JS_AtomToString(ctx_00,in_stack_ffffffffffffff5c);
    break;
  case (JSContext *)0xa:
    v_01 = JS_AtomToString(ctx_00,in_stack_ffffffffffffff5c);
    break;
  case (JSContext *)0xb:
    v_01 = JS_AtomToString(ctx_00,in_stack_ffffffffffffff5c);
    break;
  case (JSContext *)0xe:
    v_01.u.ptr = (void *)(in_stack_fffffffffffffff0._4_8_ << 0x20);
    v_01.tag = 6;
    break;
  case (JSContext *)0xf:
    v_01 = js_dtoa(unaff_retaddr,in_stack_fffffffffffffff0._8_8_,in_stack_fffffffffffffff0._4_4_,
                   in_stack_fffffffffffffff0._0_4_,iVar1);
  }
  return v_01;
}

Assistant:

JSValue JS_ToStringInternal(JSContext *ctx, JSValueConst val, BOOL is_ToPropertyKey)
{
    uint32_t tag;
    const char *str;
    char buf[32];

    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_STRING:
        return JS_DupValue(ctx, val);
    case JS_TAG_INT:
        snprintf(buf, sizeof(buf), "%d", JS_VALUE_GET_INT(val));
        str = buf;
        goto new_string;
    case JS_TAG_BOOL:
        return JS_AtomToString(ctx, JS_VALUE_GET_BOOL(val) ?
                          JS_ATOM_true : JS_ATOM_false);
    case JS_TAG_NULL:
        return JS_AtomToString(ctx, JS_ATOM_null);
    case JS_TAG_UNDEFINED:
        return JS_AtomToString(ctx, JS_ATOM_undefined);
    case JS_TAG_EXCEPTION:
        return JS_EXCEPTION;
    case JS_TAG_OBJECT:
        {
            JSValue val1, ret;
            val1 = JS_ToPrimitive(ctx, val, HINT_STRING);
            if (JS_IsException(val1))
                return val1;
            ret = JS_ToStringInternal(ctx, val1, is_ToPropertyKey);
            JS_FreeValue(ctx, val1);
            return ret;
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        str = "[function bytecode]";
        goto new_string;
    case JS_TAG_SYMBOL:
        if (is_ToPropertyKey) {
            return JS_DupValue(ctx, val);
        } else {
            return JS_ThrowTypeError(ctx, "cannot convert symbol to string");
        }
    case JS_TAG_FLOAT64:
        return js_dtoa(ctx, JS_VALUE_GET_FLOAT64(val), 10, 0,
                       JS_DTOA_VAR_FORMAT);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        return ctx->rt->bigint_ops.to_string(ctx, val);
    case JS_TAG_BIG_FLOAT:
        return ctx->rt->bigfloat_ops.to_string(ctx, val);
    case JS_TAG_BIG_DECIMAL:
        return ctx->rt->bigdecimal_ops.to_string(ctx, val);
#endif
    default:
        str = "[unsupported type]";
    new_string:
        return JS_NewString(ctx, str);
    }
}